

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  Encoding EVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  cmGeneratedFileStream *this_01;
  undefined1 auVar7 [16];
  allocator local_3f1;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  uint local_38c;
  undefined1 local_388 [8];
  cmGeneratedFileStream depFileStream;
  string local_138;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string dependFileNameFull;
  allocator local_39;
  string local_38;
  char *local_18;
  char *root;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  root = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_MAKE_INCLUDE_FROM_ROOT",&local_39);
  bVar2 = cmMakefile::IsOn(this_00,&local_38);
  local_18 = "";
  if (bVar2) {
    local_18 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string((string *)local_70,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)local_70,"/depend.make");
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                           "# Include any dependencies generated for this target.\n");
  poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,local_18);
  pcVar1 = this->LocalGenerator;
  pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,pcVar5,&local_d1);
  cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
            (&local_b0,pcVar1,&local_d0,(string *)local_70);
  auVar7 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_90,auVar7._0_8_,auVar7._8_8_);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  std::operator<<(poVar4,"\n\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if ((this->NoRuleMessages & 1U) == 0) {
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,local_18);
    pcVar1 = this->LocalGenerator;
    pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_138,pcVar5,(allocator *)&depFileStream.field_0x247);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_118,pcVar1,&local_138,&this->ProgressFileNameFull);
    auVar7 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_f8,auVar7._0_8_,auVar7._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)&local_f8);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&depFileStream.field_0x247);
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar5);
  if (!bVar2) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_388,pcVar5,false,EVar3);
    poVar4 = std::operator<<((ostream *)local_388,"# Empty dependencies file for ");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(poVar4,"# This may be replaced when dependencies are built.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_388);
  }
  std::__cxx11::string::operator=
            ((string *)&this->FlagFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::operator+=((string *)&this->FlagFileNameFull,"/flags.make");
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar5,false,EVar3);
  this->FlagFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this->FlagFileStream,true);
  bVar2 = this->FlagFileStream != (cmGeneratedFileStream *)0x0;
  if (bVar2) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,local_18);
    pcVar1 = this->LocalGenerator;
    pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,pcVar5,&local_3f1);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_3d0,pcVar1,&local_3f0,&this->FlagFileNameFull);
    auVar7 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_3b0,auVar7._0_8_,auVar7._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  }
  local_38c = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(), dependFileNameFull)
           .c_str())
    << "\n\n";

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator
             ->MaybeConvertToRelativePath(
               this->LocalGenerator->GetBinaryDirectory(),
               this->ProgressFileNameFull)
             .c_str())
      << "\n\n";
  }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str())) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFileNameFull.c_str(), false,
      this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built."
                  << std::endl;
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str(), false,
                              this->GlobalGenerator->GetMakefileEncoding());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if (!this->FlagFileStream) {
    return;
  }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(),
             this->FlagFileNameFull)
           .c_str())
    << "\n\n";
}